

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

float __thiscall pbrt::MIPMap::Lookup<float>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  int level;
  undefined1 auVar5 [16];
  Float FVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  Vector2f local_48;
  undefined1 local_28 [16];
  
  auVar15._8_56_ = in_register_00001248;
  auVar15._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar5 = auVar11._0_16_;
  auVar13 = auVar15._0_16_;
  if ((this->options).filter != EWA) {
    auVar5 = vmovlhps_avx(auVar5,auVar13);
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar5,auVar13);
    pfVar3 = (float *)local_28;
    lVar4 = 4;
    local_28 = auVar5;
    do {
      fVar12 = *(float *)(local_28 + lVar4);
      fVar7 = auVar5._0_4_;
      auVar5 = vmaxss_avx(ZEXT416((uint)fVar12),auVar5);
      if (fVar7 < fVar12) {
        pfVar3 = (float *)(local_28 + lVar4);
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10);
    fVar12 = Lookup<float>(this,st,*pfVar3 + *pfVar3);
    return fVar12;
  }
  auVar9._0_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.x *
                 dst0.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar9._4_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.y *
                 dst0.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar9._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
  auVar9._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
  auVar16._0_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar16._4_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar16._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
  auVar16._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
  auVar9 = vhaddps_avx(auVar9,auVar9);
  auVar16 = vhaddps_avx(auVar16,auVar16);
  auVar17 = auVar13;
  if (auVar16._0_4_ <= auVar9._0_4_) {
    auVar17 = auVar5;
    auVar5 = auVar13;
  }
  dst1_00 = auVar5._0_8_;
  auVar13 = vinsertps_avx(auVar5,auVar17,0x1c);
  auVar9 = vinsertps_avx(auVar17,auVar5,0x4c);
  auVar10._0_4_ = auVar13._0_4_ * auVar13._0_4_ + auVar9._0_4_ * auVar9._0_4_;
  auVar10._4_4_ = auVar13._4_4_ * auVar13._4_4_ + auVar9._4_4_ * auVar9._4_4_;
  auVar10._8_4_ = auVar13._8_4_ * auVar13._8_4_ + auVar9._8_4_ * auVar9._8_4_;
  auVar10._12_4_ = auVar13._12_4_ * auVar13._12_4_ + auVar9._12_4_ * auVar9._12_4_;
  auVar9 = vsqrtps_avx(auVar10);
  fVar7 = auVar9._0_4_;
  fVar12 = fVar7 * (this->options).maxAnisotropy;
  auVar13 = vinsertps_avx(auVar9,ZEXT416((uint)fVar12),0x1d);
  uVar1 = vcmpps_avx512vl(auVar13,auVar9,1);
  if ((~(ushort)uVar1 & 3) == 0) {
    auVar13 = vmovshdup_avx(auVar9);
    fVar12 = auVar13._0_4_ / fVar12;
    fVar7 = fVar7 * fVar12;
    dst1_00.x = auVar5._0_4_ * fVar12;
    dst1_00.y = auVar5._4_4_ * fVar12;
  }
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    FVar6 = Bilerp<float>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
    return FVar6;
  }
  sVar2 = (this->pyramid).nStored;
  fVar12 = logf(fVar7);
  auVar13 = vmaxss_avx(ZEXT416((uint)(fVar12 * 1.442695 + (float)((int)sVar2 + -1))),ZEXT416(0));
  auVar5 = vroundss_avx(auVar13,auVar13,9);
  level = (int)auVar5._0_4_;
  auVar14._0_4_ = (int)auVar5._0_4_;
  auVar14._4_4_ = (int)auVar5._4_4_;
  auVar14._8_4_ = (int)auVar5._8_4_;
  auVar14._12_4_ = (int)auVar5._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar14);
  fVar12 = auVar13._0_4_ - auVar5._0_4_;
  local_48.super_Tuple2<pbrt::Vector2,_float> = auVar17._0_8_;
  fVar7 = EWA<float>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_48,
                     (Vector2f)dst1_00);
  fVar8 = EWA<float>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_48,
                     (Vector2f)dst1_00);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar12)),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(1.0 - fVar12)));
  return auVar5._0_4_;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}